

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall Position::Position(Position *this,Position *position,Move *move)

{
  Board *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  Square source;
  stringstream ss;
  string sStack_1d8;
  Square local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  King *pKVar2;
  
  this_00 = &this->m_Board;
  Board::Board(this_00);
  (this->m_sEnPassant).i = 0;
  (this->m_sEnPassant).j = 0;
  (this->m_PreviousPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PreviousPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PreviousPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CopyFrom(this,position);
  local_1b8 = move->m_Source;
  DevirginizeRooks(this,&local_1b8);
  iVar1 = (*(this->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.
            _vptr_BoardBase[1])(this_00,(ulong)(uint)(local_1b8.j * 8 + local_1b8.i));
  pKVar2 = (King *)CONCAT44(extraout_var,iVar1);
  if (pKVar2 == &WhiteKing) {
    this->m_bVirginWhiteKing = false;
  }
  else if (pKVar2 == &BlackKing) {
    this->m_bVirginBlackKing = false;
  }
  if (move == &NullMove) {
    this->m_ColorToMove = (Color)(this->m_ColorToMove ^ 1);
  }
  else {
    if (pKVar2 == (King *)&None) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<(local_1a0,"Illegal move: no piece found at source location for move ");
      Move::operator_cast_to_string(&sStack_1d8,move);
      std::operator<<(local_1a0,(string *)&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::stringbuf::str();
      Die(&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&(this->m_PreviousPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
                ((_Vector_base<Move,_std::allocator<Move>_> *)&this->m_Captures);
      std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
                ((_Vector_base<Move,_std::allocator<Move>_> *)&this->m_Moves);
      _Unwind_Resume(extraout_RAX);
    }
    if (move->m_PromoteTo == &None.super_Piece) {
      MovePiece(this,position,move);
    }
    else {
      PromotePiece(this,position,move);
    }
    (**(this_00->super_BoardPieceSquare).super_BoardHashing.super_BoardBase._vptr_BoardBase)
              (this_00,(ulong)(((uint)((ulong)move->m_Source >> 0x1d) & 0xfffffff8) +
                              (move->m_Source).i),&None);
    this->m_ColorToMove = (Color)(this->m_ColorToMove ^ 1);
    PushHashInHistory(this);
  }
  return;
}

Assistant:

Position( const Position &position, const Move &move )
    {
        CopyFrom( position );

        Square source = move.Source();
        DevirginizeRooks( source );

        const Piece *pPiece = GetBoard().Get( source );
        DevirginizeKing( pPiece );

        if ( &move == &NullMove )
        {
            SetColorToMove( !GetColorToMove() );
            return;
        }

        if ( pPiece == &None )
        {
            stringstream ss;
            ss << "Illegal move: no piece found at source location for move ";
            ss << ( string ) move;
            Die( ss.str() );
        }

        if ( move.GetPromoteTo() == &None )
            MovePiece( position, move );
        else
            PromotePiece( position, move );

        m_Board.Set( move.Source().I(), move.Source().J(), &None );
        SetColorToMove( !GetColorToMove() );

        PushHashInHistory();
    }